

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O2

uint32_t crc32_halfbyte(void *data,size_t length,uint32_t previousCrc32)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = ~previousCrc32;
  for (sVar2 = 0; length != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = uVar1 >> 4 ^
            crc32_halfbyte::Crc32Lookup16[(uVar1 ^ *(byte *)((long)data + sVar2)) & 0xf];
    uVar1 = uVar1 >> 4 ^
            crc32_halfbyte::Crc32Lookup16[uVar1 & 0xf ^ (uint)(*(byte *)((long)data + sVar2) >> 4)];
  }
  return ~uVar1;
}

Assistant:

uint32_t crc32_halfbyte(const void* data, size_t length, uint32_t previousCrc32 = 0)
{
  uint32_t crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint8_t* current = (const uint8_t*) data;

  /// look-up table for half-byte, same as crc32Lookup[0][16*i]
  static const uint32_t Crc32Lookup16[16] =
  {
    0x00000000,0x1DB71064,0x3B6E20C8,0x26D930AC,0x76DC4190,0x6B6B51F4,0x4DB26158,0x5005713C,
    0xEDB88320,0xF00F9344,0xD6D6A3E8,0xCB61B38C,0x9B64C2B0,0x86D3D2D4,0xA00AE278,0xBDBDF21C
  };

  while (length-- != 0)
  {
    crc = Crc32Lookup16[(crc ^  *current      ) & 0x0F] ^ (crc >> 4);
    crc = Crc32Lookup16[(crc ^ (*current >> 4)) & 0x0F] ^ (crc >> 4);
    current++;
  }

  return ~crc; // same as crc ^ 0xFFFFFFFF
}